

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ArrayOrRandomizeMethodExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ArrayOrRandomizeMethodExpressionSyntax *this,
          size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  ArrayOrRandomizeMethodExpressionSyntax *this_local;
  
  switch(index) {
  case 0:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->method)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 1:
    token.kind = (this->with).kind;
    token._2_1_ = (this->with).field_0x2;
    token.numFlags.raw = (this->with).numFlags.raw;
    token.rawLen = (this->with).rawLen;
    token.info = (this->with).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->args->super_SyntaxNode);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)this->constraints);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ArrayOrRandomizeMethodExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return method.get();
        case 1: return with;
        case 2: return args;
        case 3: return constraints;
        default: return nullptr;
    }
}